

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O2

void __thiscall moira::Moira::setModel(Moira *this,Model cpuModel,Model dasmModel)

{
  u32 *puVar1;
  u32 uVar2;
  
  if ((this->cpuModel != cpuModel) || (this->dasmModel != dasmModel)) {
    this->cpuModel = cpuModel;
    this->dasmModel = dasmModel;
    createJumpTable(this,cpuModel,dasmModel);
    uVar2 = cacrMask(this);
    puVar1 = &(this->reg).cacr;
    *puVar1 = *puVar1 & uVar2;
    *(byte *)&this->flags = (byte)this->flags & 0xfb;
  }
  return;
}

Assistant:

void
Moira::setModel(Model cpuModel, Model dasmModel)
{
    if (this->cpuModel != cpuModel || this->dasmModel != dasmModel) {
        
        this->cpuModel = cpuModel;
        this->dasmModel = dasmModel;

        createJumpTable(cpuModel, dasmModel);
        
        reg.cacr &= cacrMask();
        flags &= ~State::LOOPING;
    }
}